

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnMemory
          (BinaryReaderInterp *this,Index index,Limits *limits)

{
  ModuleDesc *pMVar1;
  bool bVar2;
  Result result;
  MemoryType local_b8;
  uint64_t local_90;
  uint64_t local_88;
  undefined8 local_80;
  undefined1 local_78 [8];
  MemoryType memory_type;
  Limits *limits_local;
  Index index_local;
  BinaryReaderInterp *this_local;
  
  GetLocation((Location *)&memory_type.limits.has_max,this);
  result = SharedValidator::OnMemory
                     (&this->validator_,(Location *)&memory_type.limits.has_max,limits);
  bVar2 = Failed(result);
  if (bVar2) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    local_90 = limits->initial;
    local_88 = limits->max;
    local_80._0_1_ = limits->has_max;
    local_80._1_1_ = limits->is_shared;
    local_80._2_1_ = limits->is_64;
    local_80._3_5_ = *(undefined5 *)&limits->field_0x13;
    MemoryType::MemoryType((MemoryType *)local_78,*limits);
    pMVar1 = this->module_;
    MemoryType::MemoryType(&local_b8,(MemoryType *)local_78);
    std::vector<wabt::interp::MemoryDesc,_std::allocator<wabt::interp::MemoryDesc>_>::push_back
              (&pMVar1->memories,(value_type *)&local_b8);
    MemoryDesc::~MemoryDesc((MemoryDesc *)&local_b8);
    std::vector<wabt::interp::MemoryType,_std::allocator<wabt::interp::MemoryType>_>::push_back
              (&this->memory_types_,(value_type *)local_78);
    Result::Result((Result *)((long)&this_local + 4),Ok);
    MemoryType::~MemoryType((MemoryType *)local_78);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnMemory(Index index, const Limits* limits) {
  CHECK_RESULT(validator_.OnMemory(GetLocation(), *limits));
  MemoryType memory_type{*limits};
  module_.memories.push_back(MemoryDesc{memory_type});
  memory_types_.push_back(memory_type);
  return Result::Ok;
}